

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btSoftRigidDynamicsWorld::serializeSoftBodies
          (btSoftRigidDynamicsWorld *this,btSerializer *serializer)

{
  btCollisionObject *pbVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  for (lVar4 = 0;
      lVar4 < (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
              m_collisionObjects.m_size; lVar4 = lVar4 + 1) {
    pbVar1 = (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_collisionObjects.m_data[lVar4];
    if ((pbVar1->m_internalType & 8) != 0) {
      iVar2 = (*pbVar1->_vptr_btCollisionObject[4])(pbVar1);
      lVar3 = (**(code **)(*(long *)serializer + 0x20))(serializer,(long)iVar2,1);
      iVar2 = (*pbVar1->_vptr_btCollisionObject[5])(pbVar1,*(undefined8 *)(lVar3 + 8),serializer);
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar3,iVar2,0x59444253,pbVar1);
    }
  }
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::serializeSoftBodies(btSerializer* serializer)
{
	int i;
	//serialize all collision objects
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		if (colObj->getInternalType() & btCollisionObject::CO_SOFT_BODY)
		{
			int len = colObj->calculateSerializeBufferSize();
			btChunk* chunk = serializer->allocate(len,1);
			const char* structType = colObj->serialize(chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk,structType,BT_SOFTBODY_CODE,colObj);
		}
	}

}